

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  undefined4 in_EDX;
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  Promise<kj::HttpInputStream::Response> PVar1;
  size_t local_40;
  undefined4 local_38;
  undefined1 local_30 [28];
  HttpMethod requestMethod_local;
  HttpInputStreamImpl *this_local;
  
  local_30._20_4_ = in_EDX;
  unique0x1000006f = CONCAT44(in_register_00000034,requestMethod);
  this_local = this;
  readResponseHeaders((HttpInputStreamImpl *)local_30);
  local_38 = local_30._20_4_;
  local_40 = CONCAT44(in_register_00000034,requestMethod);
  Promise<kj::Maybe<kj::HttpHeaders::Response>>::
  then<kj::(anonymous_namespace)::HttpInputStreamImpl::readResponse(kj::HttpMethod)::_lambda(kj::Maybe<kj::HttpHeaders::Response>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Maybe<kj::HttpHeaders::Response>> *)this,(Type *)local_30,
             (PropagateException *)&local_40);
  Promise<kj::Maybe<kj::HttpHeaders::Response>_>::~Promise
            ((Promise<kj::Maybe<kj::HttpHeaders::Response>_> *)local_30);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Response>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    return readResponseHeaders()
        .then([this,requestMethod](kj::Maybe<HttpHeaders::Response>&& maybeResponse)
              -> HttpInputStream::Response {
      auto response = KJ_REQUIRE_NONNULL(maybeResponse, "bad response");
      auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod, 0, headers);

      return { response.statusCode, response.statusText, headers, kj::mv(body) };
    });
  }